

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableRepeatedMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  RepeatedPtrFieldBase *this_01;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableRepeatedMessage","Field does not match message type."
              );
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableRepeatedMessage",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableRepeatedMessage",CPPTYPE_MESSAGE);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    this_local = (GeneratedMessageReflection *)
                 ExtensionSet::MutableRepeatedMessage(this_00,number,index);
  }
  else {
    this_01 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
    this_local = (GeneratedMessageReflection *)
                 RepeatedPtrFieldBase::
                 Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                           (this_01,index);
  }
  return (Message *)this_local;
}

Assistant:

Message* GeneratedMessageReflection::MutableRepeatedMessage(
    Message* message, const FieldDescriptor* field, int index) const {
  USAGE_CHECK_ALL(MutableRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableRepeatedMessage(
          field->number(), index));
  } else {
    return MutableRaw<RepeatedPtrFieldBase>(message, field)
        ->Mutable<GenericTypeHandler<Message> >(index);
  }
}